

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O0

void __thiscall
re2c::DFA::emit_body
          (DFA *this,OutputFile *o,uint32_t *ind,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_labels,
          label_t initial)

{
  uint32_t ind_00;
  State *s_00;
  uint32_t *o_00;
  size_type sVar1;
  OutputFile *pOVar2;
  opt_t *poVar3;
  size_t sVar4;
  bool local_41;
  State *pSStack_40;
  bool readCh;
  State *s;
  bool save_yyaccept;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *psStack_30;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_labels_local;
  uint32_t *ind_local;
  OutputFile *o_local;
  DFA *this_local;
  label_t initial_local;
  
  psStack_30 = used_labels;
  used_labels_local =
       (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)ind;
  ind_local = (uint32_t *)o;
  o_local = (OutputFile *)this;
  this_local._4_4_ = initial.value;
  sVar1 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                    (used_labels,&this->head->label);
  if (sVar1 != 0) {
    pOVar2 = OutputFile::wind((OutputFile *)ind_local,
                              *(uint32_t *)&(used_labels_local->_M_t)._M_impl);
    pOVar2 = OutputFile::ws(pOVar2,"goto ");
    poVar3 = Opt::operator->((Opt *)&opts);
    pOVar2 = OutputFile::wstring(pOVar2,&poVar3->labelPrefix);
    s._4_4_ = this_local._4_4_;
    pOVar2 = OutputFile::wlabel(pOVar2,this_local._4_4_);
    OutputFile::ws(pOVar2,";\n");
  }
  sVar4 = uniq_vector_t<const_re2c::State_*>::size(&this->accepts);
  s._3_1_ = 1 < sVar4;
  for (pSStack_40 = this->head; o_00 = ind_local, s_00 = pSStack_40, pSStack_40 != (State *)0x0;
      pSStack_40 = pSStack_40->next) {
    local_41 = false;
    ind_00 = *(uint32_t *)&(used_labels_local->_M_t)._M_impl;
    sVar1 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                      (psStack_30,&pSStack_40->label);
    emit_state((OutputFile *)o_00,ind_00,s_00,sVar1 != 0);
    emit_action(&pSStack_40->action,(OutputFile *)ind_local,
                *(uint32_t *)&(used_labels_local->_M_t)._M_impl,&local_41,pSStack_40,&this->cond,
                this->skeleton,psStack_30,(bool)(s._3_1_ & 1));
    Go::emit(&pSStack_40->go,(OutputFile *)ind_local,*(uint32_t *)&(used_labels_local->_M_t)._M_impl
             ,&local_41);
  }
  return;
}

Assistant:

void DFA::emit_body (OutputFile & o, uint32_t& ind, const std::set<label_t> & used_labels, label_t initial) const
{
	// If DFA has transitions to initial state, then initial state
	// has a piece of code that advances input position. Wee must
	// skip it when entering DFA.
	if (used_labels.count(head->label))
	{
		o.wind(ind).ws("goto ").wstring(opts->labelPrefix).wlabel(initial).ws(";\n");
	}

	const bool save_yyaccept = accepts.size () > 1;
	for (State * s = head; s; s = s->next)
	{
		bool readCh = false;
		emit_state (o, ind, s, used_labels.count (s->label) != 0);
		emit_action (s->action, o, ind, readCh, s, cond, skeleton, used_labels, save_yyaccept);
		s->go.emit(o, ind, readCh);
	}
}